

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc_inl.h
# Opt level: O2

OPJ_UINT32 opj_mqc_raw_decode(opj_mqc_t *mqc)

{
  byte *pbVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  
  uVar2 = mqc->c;
  OVar3 = mqc->ct;
  if (OVar3 == 0) {
    pbVar1 = mqc->bp;
    bVar4 = uVar2 == 0xff;
    uVar2 = (uint)*pbVar1;
    if (bVar4) {
      if (*pbVar1 < 0x90) {
        mqc->c = uVar2;
        mqc->bp = pbVar1 + 1;
        OVar3 = 7;
      }
      else {
        mqc->c = 0xff;
        OVar3 = 8;
        uVar2 = 0xff;
      }
    }
    else {
      mqc->c = uVar2;
      mqc->bp = pbVar1 + 1;
      OVar3 = 8;
    }
  }
  mqc->ct = OVar3 - 1;
  return (OPJ_UINT32)((uVar2 >> (OVar3 - 1 & 0x1f) & 1) != 0);
}

Assistant:

static INLINE OPJ_UINT32 opj_mqc_raw_decode(opj_mqc_t *mqc)
{
    OPJ_UINT32 d;
    if (mqc->ct == 0) {
        /* Given opj_mqc_raw_init_dec() we know that at some point we will */
        /* have a 0xFF 0xFF artificial marker */
        if (mqc->c == 0xff) {
            if (*mqc->bp  > 0x8f) {
                mqc->c = 0xff;
                mqc->ct = 8;
            } else {
                mqc->c = *mqc->bp;
                mqc->bp ++;
                mqc->ct = 7;
            }
        } else {
            mqc->c = *mqc->bp;
            mqc->bp ++;
            mqc->ct = 8;
        }
    }
    mqc->ct--;
    d = ((OPJ_UINT32)mqc->c >> mqc->ct) & 0x01U;

    return d;
}